

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O1

void YuvToRgbaRow_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst,int len)

{
  undefined4 uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [16];
  undefined1 auVar34 [15];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [15];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [14];
  undefined1 auVar45 [12];
  unkbyte10 Var46;
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  unkbyte9 Var50;
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [13];
  undefined1 auVar55 [15];
  undefined1 auVar56 [13];
  undefined1 auVar57 [15];
  undefined1 auVar58 [13];
  undefined1 auVar59 [15];
  undefined6 uVar60;
  undefined2 uVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  uint uVar69;
  uint8_t uVar70;
  uint uVar71;
  int iVar72;
  long lVar73;
  uint8_t uVar74;
  uint uVar75;
  uint uVar76;
  undefined1 uVar86;
  undefined1 uVar87;
  undefined1 uVar88;
  byte bVar89;
  byte bVar90;
  byte bVar91;
  byte bVar92;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  ushort uVar93;
  char cVar98;
  ushort uVar99;
  ushort uVar100;
  ushort uVar101;
  ushort uVar102;
  ushort uVar103;
  ushort uVar104;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  ushort uVar105;
  undefined1 auVar97 [16];
  undefined2 uVar106;
  undefined1 auVar112 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined4 uVar107;
  undefined6 uVar108;
  undefined8 uVar109;
  undefined1 auVar110 [12];
  undefined1 auVar111 [14];
  undefined1 auVar113 [16];
  
  auVar68 = _DAT_0018ae80;
  auVar67 = _DAT_0018ae70;
  auVar66 = _DAT_0018ae50;
  auVar65 = _DAT_0018ae40;
  auVar64 = _DAT_0018ae20;
  auVar63 = _DAT_0018ae10;
  auVar62 = _DAT_0018ac20;
  uVar69 = 0;
  if (7 < len) {
    uVar69 = len & 0x7ffffff8;
    iVar72 = 8;
    do {
      uVar109 = *(undefined8 *)y;
      bVar92 = (byte)((ulong)uVar109 >> 0x38);
      bVar91 = (byte)((ulong)uVar109 >> 0x30);
      bVar90 = (byte)((ulong)uVar109 >> 0x28);
      auVar51[10] = 0;
      auVar51._0_10_ = SUB1610((undefined1  [16])0x0,0);
      auVar51[0xb] = bVar90;
      bVar89 = (byte)((ulong)uVar109 >> 0x20);
      auVar52[9] = bVar89;
      auVar52._0_9_ = SUB169((undefined1  [16])0x0,0);
      auVar52._10_2_ = auVar51._10_2_;
      auVar53._9_3_ = auVar52._9_3_;
      auVar53._0_9_ = (unkuint9)0;
      uVar88 = (undefined1)((ulong)uVar109 >> 0x18);
      uVar87 = (undefined1)((ulong)uVar109 >> 0x10);
      auVar33._1_10_ = SUB1610(ZEXT516(CONCAT41(auVar53._8_4_,uVar88)) << 0x38,6);
      auVar33[0] = uVar87;
      auVar33._11_5_ = 0;
      uVar86 = (undefined1)((ulong)uVar109 >> 8);
      auVar117._1_12_ = SUB1612(auVar33 << 0x28,4);
      auVar117[0] = uVar86;
      auVar117._13_3_ = 0;
      auVar78._1_14_ = SUB1614(auVar117 << 0x18,2);
      auVar78[0] = (char)uVar109;
      auVar78[0xf] = 0;
      auVar78 = auVar78 << 8;
      auVar18[0xd] = 0;
      auVar18._0_13_ = auVar78._0_13_;
      auVar18[0xe] = uVar88;
      auVar21[0xc] = 0;
      auVar21._0_12_ = auVar78._0_12_;
      auVar21._13_2_ = auVar18._13_2_;
      auVar24[0xb] = 0;
      auVar24._0_11_ = auVar78._0_11_;
      auVar24._12_3_ = auVar21._12_3_;
      auVar27[10] = uVar87;
      auVar27._0_10_ = auVar78._0_10_;
      auVar27._11_4_ = auVar24._11_4_;
      auVar30[9] = 0;
      auVar30._0_9_ = auVar78._0_9_;
      auVar30._10_5_ = auVar27._10_5_;
      auVar34[8] = 0;
      auVar34._0_8_ = auVar78._0_8_;
      auVar34._9_6_ = auVar30._9_6_;
      auVar41._7_8_ = 0;
      auVar41._0_7_ = auVar34._8_7_;
      auVar47._1_8_ = SUB158(auVar41 << 0x40,7);
      auVar47[0] = uVar86;
      auVar47._9_6_ = 0;
      auVar55._10_5_ = 0;
      auVar55._0_10_ = SUB1510(auVar47 << 0x30,5);
      auVar54._1_12_ = SUB1512(auVar55 << 0x28,3);
      auVar54[0] = (char)uVar109;
      auVar77._4_3_ = auVar21._12_3_;
      auVar77._0_4_ = auVar54._0_4_ << 0x10;
      auVar77[7] = 0;
      auVar77._8_4_ = auVar34._8_4_;
      auVar77._12_4_ = SUB154(auVar47 << 0x30,5) << 8;
      auVar78 = pshufhw(auVar77,auVar77,0xc4);
      auVar79._0_4_ = auVar78._0_4_;
      auVar79._8_4_ = auVar78._8_4_;
      auVar79._4_4_ = auVar78._12_4_;
      auVar79._12_4_ = auVar78._4_4_;
      auVar79 = auVar79 & auVar62;
      sVar2 = auVar79._0_2_;
      sVar3 = auVar79._2_2_;
      auVar80[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar79[2] - (0xff < sVar3);
      auVar80[0] = (0 < sVar2) * (sVar2 < 0x100) * auVar79[0] - (0xff < sVar2);
      sVar2 = auVar79._4_2_;
      auVar80[2] = (0 < sVar2) * (sVar2 < 0x100) * auVar79[4] - (0xff < sVar2);
      sVar2 = auVar79._6_2_;
      auVar80[3] = (0 < sVar2) * (sVar2 < 0x100) * auVar79[6] - (0xff < sVar2);
      sVar2 = auVar79._8_2_;
      auVar80[4] = (0 < sVar2) * (sVar2 < 0x100) * auVar79[8] - (0xff < sVar2);
      sVar2 = auVar79._10_2_;
      auVar80[5] = (0 < sVar2) * (sVar2 < 0x100) * auVar79[10] - (0xff < sVar2);
      sVar2 = auVar79._12_2_;
      auVar80[6] = (0 < sVar2) * (sVar2 < 0x100) * auVar79[0xc] - (0xff < sVar2);
      sVar2 = auVar79._14_2_;
      auVar80[7] = (0 < sVar2) * (sVar2 < 0x100) * auVar79[0xe] - (0xff < sVar2);
      auVar80[8] = 0;
      auVar80[9] = (bVar89 != 0) * (bVar89 < 0x100) * bVar89 - (0xff < bVar89);
      auVar80[10] = 0;
      auVar80[0xb] = (bVar90 != 0) * (bVar90 < 0x100) * bVar90 - (0xff < bVar90);
      auVar80[0xc] = 0;
      auVar80[0xd] = (bVar91 != 0) * (bVar91 < 0x100) * bVar91 - (0xff < bVar91);
      auVar80[0xe] = 0;
      auVar80[0xf] = (bVar92 != 0) * (bVar92 < 0x100) * bVar92 - (0xff < bVar92);
      auVar78 = pmulhuw(auVar80,auVar63);
      uVar1 = *(undefined4 *)u;
      bVar89 = (byte)((uint)uVar1 >> 0x18);
      cVar98 = (char)((uint)uVar1 >> 0x10);
      auVar36._1_10_ = SUB1610(ZEXT116(bVar89) << 0x38,6);
      auVar36[0] = cVar98;
      auVar36._11_5_ = 0;
      uVar86 = (undefined1)((uint)uVar1 >> 8);
      auVar35._1_12_ = SUB1612(auVar36 << 0x28,4);
      auVar35[0] = uVar86;
      auVar35._13_3_ = 0;
      auVar95._1_14_ = SUB1614(auVar35 << 0x18,2);
      auVar95[0] = (char)uVar1;
      auVar95[0xf] = 0;
      auVar95 = auVar95 << 8;
      auVar19[0xd] = 0;
      auVar19._0_13_ = auVar95._0_13_;
      auVar19[0xe] = bVar89;
      auVar22[0xc] = 0;
      auVar22._0_12_ = auVar95._0_12_;
      auVar22._13_2_ = auVar19._13_2_;
      auVar25[0xb] = 0;
      auVar25._0_11_ = auVar95._0_11_;
      auVar25._12_3_ = auVar22._12_3_;
      auVar28[10] = cVar98;
      auVar28._0_10_ = auVar95._0_10_;
      auVar28._11_4_ = auVar25._11_4_;
      auVar31[9] = 0;
      auVar31._0_9_ = auVar95._0_9_;
      auVar31._10_5_ = auVar28._10_5_;
      auVar37[8] = 0;
      auVar37._0_8_ = auVar95._0_8_;
      auVar37._9_6_ = auVar31._9_6_;
      auVar42._7_8_ = 0;
      auVar42._0_7_ = auVar37._8_7_;
      auVar48._1_8_ = SUB158(auVar42 << 0x40,7);
      auVar48[0] = uVar86;
      auVar48._9_6_ = 0;
      auVar57._10_5_ = 0;
      auVar57._0_10_ = SUB1510(auVar48 << 0x30,5);
      auVar56._1_12_ = SUB1512(auVar57 << 0x28,3);
      auVar56[0] = (char)uVar1;
      auVar94._4_4_ = auVar37._8_4_;
      auVar94._0_4_ = auVar56._0_4_ << 0x10;
      auVar94._8_4_ = auVar37._8_4_;
      auVar94._12_4_ = SUB154(auVar48 << 0x30,5) << 8;
      auVar95 = pshuflw(auVar94,auVar94,100);
      auVar95 = pshufhw(auVar95,auVar95,0xcc);
      sVar2 = auVar95._0_2_;
      sVar3 = auVar95._2_2_;
      auVar96[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar95[2] - (0xff < sVar3);
      auVar96[0] = (0 < sVar2) * (sVar2 < 0x100) * auVar95[0] - (0xff < sVar2);
      sVar2 = auVar95._4_2_;
      auVar96[2] = (0 < sVar2) * (sVar2 < 0x100) * auVar95[4] - (0xff < sVar2);
      sVar2 = auVar95._6_2_;
      auVar96[3] = (0 < sVar2) * (sVar2 < 0x100) * auVar95[6] - (0xff < sVar2);
      sVar2 = auVar95._8_2_;
      auVar96[4] = (0 < sVar2) * (sVar2 < 0x100) * auVar95[8] - (0xff < sVar2);
      sVar2 = auVar95._10_2_;
      auVar96[5] = (0 < sVar2) * (sVar2 < 0x100) * auVar95[10] - (0xff < sVar2);
      sVar2 = auVar95._12_2_;
      auVar96[6] = (0 < sVar2) * (sVar2 < 0x100) * auVar95[0xc] - (0xff < sVar2);
      sVar2 = auVar95._14_2_;
      auVar96[7] = (0 < sVar2) * (sVar2 < 0x100) * auVar95[0xe] - (0xff < sVar2);
      auVar96[8] = -(0xff < auVar37._8_2_);
      sVar2 = auVar28._10_2_;
      auVar96[9] = (0 < sVar2) * (sVar2 < 0x100) * cVar98 - (0xff < sVar2);
      auVar96[10] = -(0xff < auVar37._8_2_);
      auVar96[0xb] = (0 < sVar2) * (sVar2 < 0x100) * cVar98 - (0xff < sVar2);
      auVar96[0xc] = -(0xff < auVar22._12_2_);
      uVar93 = (ushort)bVar89;
      auVar96[0xd] = (bVar89 != 0) * (uVar93 < 0x100) * bVar89 - (0xff < uVar93);
      auVar96[0xe] = -(0xff < auVar22._12_2_);
      auVar96[0xf] = (bVar89 != 0) * (uVar93 < 0x100) * bVar89 - (0xff < uVar93);
      uVar1 = *(undefined4 *)v;
      bVar89 = (byte)((uint)uVar1 >> 0x18);
      cVar98 = (char)((uint)uVar1 >> 0x10);
      auVar39._1_10_ = SUB1610(ZEXT116(bVar89) << 0x38,6);
      auVar39[0] = cVar98;
      auVar39._11_5_ = 0;
      uVar86 = (undefined1)((uint)uVar1 >> 8);
      auVar38._1_12_ = SUB1612(auVar39 << 0x28,4);
      auVar38[0] = uVar86;
      auVar38._13_3_ = 0;
      auVar116._1_14_ = SUB1614(auVar38 << 0x18,2);
      auVar116[0] = (char)uVar1;
      auVar116[0xf] = 0;
      auVar116 = auVar116 << 8;
      auVar20[0xd] = 0;
      auVar20._0_13_ = auVar116._0_13_;
      auVar20[0xe] = bVar89;
      auVar23[0xc] = 0;
      auVar23._0_12_ = auVar116._0_12_;
      auVar23._13_2_ = auVar20._13_2_;
      auVar26[0xb] = 0;
      auVar26._0_11_ = auVar116._0_11_;
      auVar26._12_3_ = auVar23._12_3_;
      auVar29[10] = cVar98;
      auVar29._0_10_ = auVar116._0_10_;
      auVar29._11_4_ = auVar26._11_4_;
      auVar32[9] = 0;
      auVar32._0_9_ = auVar116._0_9_;
      auVar32._10_5_ = auVar29._10_5_;
      auVar40[8] = 0;
      auVar40._0_8_ = auVar116._0_8_;
      auVar40._9_6_ = auVar32._9_6_;
      auVar43._7_8_ = 0;
      auVar43._0_7_ = auVar40._8_7_;
      auVar49._1_8_ = SUB158(auVar43 << 0x40,7);
      auVar49[0] = uVar86;
      auVar49._9_6_ = 0;
      auVar59._10_5_ = 0;
      auVar59._0_10_ = SUB1510(auVar49 << 0x30,5);
      auVar58._1_12_ = SUB1512(auVar59 << 0x28,3);
      auVar58[0] = (char)uVar1;
      auVar114._0_4_ = auVar58._0_4_ << 0x10;
      auVar114._8_4_ = auVar40._8_4_;
      auVar114._4_4_ = auVar114._8_4_;
      auVar114._12_4_ = SUB154(auVar49 << 0x30,5) << 8;
      auVar95 = pshuflw(auVar114,auVar114,100);
      auVar95 = pshufhw(auVar95,auVar95,0xcc);
      sVar2 = auVar95._0_2_;
      sVar3 = auVar95._2_2_;
      auVar115[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar95[2] - (0xff < sVar3);
      auVar115[0] = (0 < sVar2) * (sVar2 < 0x100) * auVar95[0] - (0xff < sVar2);
      sVar2 = auVar95._4_2_;
      auVar115[2] = (0 < sVar2) * (sVar2 < 0x100) * auVar95[4] - (0xff < sVar2);
      sVar2 = auVar95._6_2_;
      auVar115[3] = (0 < sVar2) * (sVar2 < 0x100) * auVar95[6] - (0xff < sVar2);
      sVar2 = auVar95._8_2_;
      auVar115[4] = (0 < sVar2) * (sVar2 < 0x100) * auVar95[8] - (0xff < sVar2);
      sVar2 = auVar95._10_2_;
      auVar115[5] = (0 < sVar2) * (sVar2 < 0x100) * auVar95[10] - (0xff < sVar2);
      sVar2 = auVar95._12_2_;
      auVar115[6] = (0 < sVar2) * (sVar2 < 0x100) * auVar95[0xc] - (0xff < sVar2);
      sVar2 = auVar95._14_2_;
      auVar115[7] = (0 < sVar2) * (sVar2 < 0x100) * auVar95[0xe] - (0xff < sVar2);
      auVar115[8] = -(0xff < auVar40._8_2_);
      sVar2 = auVar29._10_2_;
      auVar115[9] = (0 < sVar2) * (sVar2 < 0x100) * cVar98 - (0xff < sVar2);
      auVar115[10] = -(0xff < auVar40._8_2_);
      auVar115[0xb] = (0 < sVar2) * (sVar2 < 0x100) * cVar98 - (0xff < sVar2);
      auVar115[0xc] = -(0xff < auVar23._12_2_);
      uVar93 = (ushort)bVar89;
      auVar115[0xd] = (bVar89 != 0) * (uVar93 < 0x100) * bVar89 - (0xff < uVar93);
      auVar115[0xe] = -(0xff < auVar23._12_2_);
      auVar115[0xf] = (bVar89 != 0) * (uVar93 < 0x100) * bVar89 - (0xff < uVar93);
      auVar95 = pmulhuw(auVar115,auVar64);
      auVar112._0_2_ = auVar95._0_2_ + auVar78._0_2_ + -0x379a;
      auVar112._2_2_ = auVar95._2_2_ + auVar78._2_2_ + -0x379a;
      auVar112._4_2_ = auVar95._4_2_ + auVar78._4_2_ + -0x379a;
      auVar112._6_2_ = auVar95._6_2_ + auVar78._6_2_ + -0x379a;
      auVar112._8_2_ = auVar95._8_2_ + auVar78._8_2_ + -0x379a;
      auVar112._10_2_ = auVar95._10_2_ + auVar78._10_2_ + -0x379a;
      auVar112._12_2_ = auVar95._12_2_ + auVar78._12_2_ + -0x379a;
      auVar112._14_2_ = auVar95._14_2_ + auVar78._14_2_ + -0x379a;
      auVar117 = pmulhuw(auVar96,auVar65);
      auVar116 = pmulhuw(auVar115,auVar66);
      auVar95 = pmulhuw(auVar96,auVar67);
      auVar95 = paddusw(auVar95,auVar78);
      auVar81._0_2_ = (auVar78._0_2_ - (auVar116._0_2_ + auVar117._0_2_)) + 0x2204;
      auVar81._2_2_ = (auVar78._2_2_ - (auVar116._2_2_ + auVar117._2_2_)) + 0x2204;
      auVar81._4_2_ = (auVar78._4_2_ - (auVar116._4_2_ + auVar117._4_2_)) + 0x2204;
      auVar81._6_2_ = (auVar78._6_2_ - (auVar116._6_2_ + auVar117._6_2_)) + 0x2204;
      auVar81._8_2_ = (auVar78._8_2_ - (auVar116._8_2_ + auVar117._8_2_)) + 0x2204;
      auVar81._10_2_ = (auVar78._10_2_ - (auVar116._10_2_ + auVar117._10_2_)) + 0x2204;
      auVar81._12_2_ = (auVar78._12_2_ - (auVar116._12_2_ + auVar117._12_2_)) + 0x2204;
      auVar81._14_2_ = (auVar78._14_2_ - (auVar116._14_2_ + auVar117._14_2_)) + 0x2204;
      auVar95 = psubusw(auVar95,auVar68);
      auVar116 = psraw(auVar112,6);
      auVar78 = psraw(auVar81,6);
      sVar2 = auVar78._0_2_;
      sVar4 = auVar78._2_2_;
      sVar6 = auVar78._4_2_;
      sVar8 = auVar78._6_2_;
      sVar10 = auVar78._8_2_;
      sVar12 = auVar78._10_2_;
      sVar14 = auVar78._12_2_;
      sVar16 = auVar78._14_2_;
      uVar93 = auVar95._0_2_ >> 6;
      uVar99 = auVar95._2_2_ >> 6;
      uVar100 = auVar95._4_2_ >> 6;
      uVar101 = auVar95._6_2_ >> 6;
      uVar102 = auVar95._8_2_ >> 6;
      uVar103 = auVar95._10_2_ >> 6;
      uVar104 = auVar95._12_2_ >> 6;
      uVar105 = auVar95._14_2_ >> 6;
      sVar3 = auVar116._0_2_;
      sVar5 = auVar116._2_2_;
      sVar7 = auVar116._4_2_;
      sVar9 = auVar116._6_2_;
      sVar11 = auVar116._8_2_;
      sVar13 = auVar116._10_2_;
      sVar15 = auVar116._12_2_;
      sVar17 = auVar116._14_2_;
      cVar98 = (0 < sVar17) * (sVar17 < 0x100) * auVar116[0xe] - (0xff < sVar17);
      uVar61 = CONCAT11((0 < sVar16) * (sVar16 < 0x100) * auVar78[0xe] - (0xff < sVar16),cVar98);
      uVar1 = CONCAT31(CONCAT21(uVar61,(0 < sVar14) * (sVar14 < 0x100) * auVar78[0xc] -
                                       (0xff < sVar14)),
                       (0 < sVar15) * (sVar15 < 0x100) * auVar116[0xc] - (0xff < sVar15));
      uVar60 = CONCAT51(CONCAT41(uVar1,(0 < sVar12) * (sVar12 < 0x100) * auVar78[10] -
                                       (0xff < sVar12)),
                        (0 < sVar13) * (sVar13 < 0x100) * auVar116[10] - (0xff < sVar13));
      Var50 = CONCAT72(CONCAT61(uVar60,(0 < sVar10) * (sVar10 < 0x100) * auVar78[8] -
                                       (0xff < sVar10)),
                       CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar116[8] - (0xff < sVar11),
                                cVar98));
      Var46 = CONCAT91(CONCAT81((long)((unkuint9)Var50 >> 8),
                                (0 < sVar8) * (sVar8 < 0x100) * auVar78[6] - (0xff < sVar8)),
                       (0 < sVar9) * (sVar9 < 0x100) * auVar116[6] - (0xff < sVar9));
      auVar45._2_10_ = Var46;
      auVar45[1] = (0 < sVar6) * (sVar6 < 0x100) * auVar78[4] - (0xff < sVar6);
      auVar45[0] = (0 < sVar7) * (sVar7 < 0x100) * auVar116[4] - (0xff < sVar7);
      auVar44._2_12_ = auVar45;
      auVar44[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar78[2] - (0xff < sVar4);
      auVar44[0] = (0 < sVar5) * (sVar5 < 0x100) * auVar116[2] - (0xff < sVar5);
      auVar97._0_2_ =
           CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar78[0] - (0xff < sVar2),
                    (0 < sVar3) * (sVar3 < 0x100) * auVar116[0] - (0xff < sVar3));
      auVar97._2_14_ = auVar44;
      uVar106 = CONCAT11(0xff,(uVar93 != 0) * (uVar93 < 0x100) * (char)uVar93 - (0xff < uVar93));
      uVar107 = CONCAT13(0xff,CONCAT12((uVar99 != 0) * (uVar99 < 0x100) * (char)uVar99 -
                                       (0xff < uVar99),uVar106));
      uVar108 = CONCAT15(0xff,CONCAT14((uVar100 != 0) * (uVar100 < 0x100) * (char)uVar100 -
                                       (0xff < uVar100),uVar107));
      uVar109 = CONCAT17(0xff,CONCAT16((uVar101 != 0) * (uVar101 < 0x100) * (char)uVar101 -
                                       (0xff < uVar101),uVar108));
      auVar110._0_10_ =
           CONCAT19(0xff,CONCAT18((uVar102 != 0) * (uVar102 < 0x100) * (char)uVar102 -
                                  (0xff < uVar102),uVar109));
      auVar110[10] = (uVar103 != 0) * (uVar103 < 0x100) * (char)uVar103 - (0xff < uVar103);
      auVar110[0xb] = 0xff;
      auVar111[0xc] = (uVar104 != 0) * (uVar104 < 0x100) * (char)uVar104 - (0xff < uVar104);
      auVar111._0_12_ = auVar110;
      auVar111[0xd] = 0xff;
      auVar113[0xe] = (uVar105 != 0) * (uVar105 < 0x100) * (char)uVar105 - (0xff < uVar105);
      auVar113._0_14_ = auVar111;
      auVar113[0xf] = 0xff;
      auVar85._0_12_ = auVar97._0_12_;
      auVar85._12_2_ = (short)Var46;
      auVar85._14_2_ = (short)((ulong)uVar109 >> 0x30);
      auVar84._12_4_ = auVar85._12_4_;
      auVar84._0_10_ = auVar97._0_10_;
      auVar84._10_2_ = (short)((uint6)uVar108 >> 0x20);
      auVar83._10_6_ = auVar84._10_6_;
      auVar83._0_8_ = auVar97._0_8_;
      auVar83._8_2_ = auVar45._0_2_;
      auVar82._8_8_ = auVar83._8_8_;
      auVar82._6_2_ = (short)((uint)uVar107 >> 0x10);
      auVar82._4_2_ = auVar44._0_2_;
      auVar82._2_2_ = uVar106;
      auVar82._0_2_ = auVar97._0_2_;
      *(undefined1 (*) [16])dst = auVar82;
      *(short *)*(undefined1 (*) [16])((long)dst + 0x10) = (short)((unkuint9)Var50 >> 8);
      *(short *)(*(undefined1 (*) [16])((long)dst + 0x10) + 2) =
           (short)((unkuint10)auVar110._0_10_ >> 0x40);
      *(short *)(*(undefined1 (*) [16])((long)dst + 0x10) + 4) = (short)uVar60;
      *(short *)(*(undefined1 (*) [16])((long)dst + 0x10) + 6) = auVar110._10_2_;
      *(short *)(*(undefined1 (*) [16])((long)dst + 0x10) + 8) = (short)uVar1;
      *(short *)(*(undefined1 (*) [16])((long)dst + 0x10) + 10) = auVar111._12_2_;
      *(undefined2 *)(*(undefined1 (*) [16])((long)dst + 0x10) + 0xc) = uVar61;
      *(short *)(*(undefined1 (*) [16])((long)dst + 0x10) + 0xe) = auVar113._14_2_;
      y = y + 8;
      u = u + 4;
      v = v + 4;
      dst = (uint8_t *)((long)dst + 0x20);
      iVar72 = iVar72 + 8;
    } while (iVar72 <= len);
  }
  if ((int)uVar69 < len) {
    lVar73 = 0;
    do {
      bVar89 = *u;
      bVar90 = *v;
      uVar71 = (uint)y[lVar73] * 0x4a85 >> 8;
      uVar75 = ((uint)bVar90 * 0x6625 >> 8) + uVar71;
      uVar76 = uVar75 - 0x379a;
      uVar74 = (uVar75 < 0x379a) + 0xff;
      if (uVar76 < 0x4000) {
        uVar74 = (uint8_t)(uVar76 >> 6);
      }
      (*(undefined1 (*) [16])dst)[lVar73 * 4] = uVar74;
      iVar72 = ((uint)bVar90 * 0x3408 >> 8) + ((uint)bVar89 * 0x1913 >> 8);
      uVar75 = (uVar71 - iVar72) + 0x2204;
      uVar74 = -(-0x2205 < (int)(uVar71 - iVar72));
      if (uVar75 < 0x4000) {
        uVar74 = (uint8_t)(uVar75 >> 6);
      }
      uVar71 = ((uint)bVar89 * 0x811a >> 8) + uVar71;
      uVar75 = uVar71 - 0x4515;
      uVar70 = (uVar71 < 0x4515) + 0xff;
      if (uVar75 < 0x4000) {
        uVar70 = (uint8_t)(uVar75 >> 6);
      }
      (*(undefined1 (*) [16])dst)[lVar73 * 4 + 1] = uVar74;
      (*(undefined1 (*) [16])dst)[lVar73 * 4 + 2] = uVar70;
      (*(undefined1 (*) [16])dst)[lVar73 * 4 + 3] = 0xff;
      uVar71 = uVar69 + (int)lVar73 & 1;
      u = u + uVar71;
      v = v + uVar71;
      lVar73 = lVar73 + 1;
    } while (len - uVar69 != (int)lVar73);
  }
  return;
}

Assistant:

static void YuvToRgbaRow_SSE2(const uint8_t* WEBP_RESTRICT y,
                              const uint8_t* WEBP_RESTRICT u,
                              const uint8_t* WEBP_RESTRICT v,
                              uint8_t* WEBP_RESTRICT dst, int len) {
  const __m128i kAlpha = _mm_set1_epi16(255);
  int n;
  for (n = 0; n + 8 <= len; n += 8, dst += 32) {
    __m128i R, G, B;
    YUV420ToRGB_SSE2(y, u, v, &R, &G, &B);
    PackAndStore4_SSE2(&R, &G, &B, &kAlpha, dst);
    y += 8;
    u += 4;
    v += 4;
  }
  for (; n < len; ++n) {   // Finish off
    VP8YuvToRgba(y[0], u[0], v[0], dst);
    dst += 4;
    y += 1;
    u += (n & 1);
    v += (n & 1);
  }
}